

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

void __thiscall
Js::DynamicType::DynamicType
          (DynamicType *this,DynamicType *type,DynamicTypeHandler *typeHandler,bool isLocked,
          bool isShared)

{
  code *pcVar1;
  bool bVar2;
  DynamicTypeHandler *pDVar3;
  undefined4 *puVar4;
  bool isShared_local;
  bool isLocked_local;
  DynamicTypeHandler *typeHandler_local;
  DynamicType *type_local;
  DynamicType *this_local;
  
  Js::Type::Type(&this->super_Type,&type->super_Type);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr(&this->typeHandler,typeHandler);
  this->isLocked = isLocked;
  this->isShared = isShared;
  this->isCachedForChangePrototype = false;
  if ((this->isLocked & 1U) != 0) {
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator->(&this->typeHandler);
    bVar2 = DynamicTypeHandler::GetIsLocked(pDVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x12,"(!this->isLocked || this->typeHandler->GetIsLocked())",
                                  "!this->isLocked || this->typeHandler->GetIsLocked()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if ((this->isShared & 1U) != 0) {
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator->(&this->typeHandler);
    bVar2 = DynamicTypeHandler::GetIsShared(pDVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x13,"(!this->isShared || this->typeHandler->GetIsShared())",
                                  "!this->isShared || this->typeHandler->GetIsShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

DynamicType::DynamicType(DynamicType * type, DynamicTypeHandler *typeHandler, bool isLocked, bool isShared)
        : Type(type), typeHandler(typeHandler), isLocked(isLocked), isShared(isShared)
#if DBG
        , isCachedForChangePrototype(false)
#endif
    {
        Assert(!this->isLocked || this->typeHandler->GetIsLocked());
        Assert(!this->isShared || this->typeHandler->GetIsShared());
    }